

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonEachFilter(sqlite3_vtab_cursor *cur,int idxNum,char *idxStr,int argc,sqlite3_value **argv)

{
  JsonParse *pParse;
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *__src;
  sqlite3_vtab *psVar5;
  char *pcVar6;
  sqlite3_vtab *psVar7;
  char *zErr;
  char *local_38;
  
  jsonEachCursorReset((JsonEachCursor *)cur);
  if (idxNum == 0) {
    return 0;
  }
  __src = sqlite3ValueText(*argv,'\x01');
  if (__src == (void *)0x0) {
    return 0;
  }
  iVar3 = sqlite3ValueBytes(*argv,'\x01');
  iVar4 = sqlite3_initialize();
  if (iVar4 != 0) {
    cur[4].pVtab = (sqlite3_vtab *)0x0;
    return 7;
  }
  psVar5 = (sqlite3_vtab *)sqlite3Malloc((long)iVar3 + 1U);
  cur[4].pVtab = psVar5;
  if (psVar5 == (sqlite3_vtab *)0x0) {
    return 7;
  }
  memcpy(psVar5,__src,(long)iVar3 + 1U);
  pParse = (JsonParse *)(cur + 6);
  iVar3 = jsonParse(pParse,(sqlite3_context *)0x0,(char *)cur[4].pVtab);
  if (iVar3 == 0) {
    if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
LAB_001a2fc8:
      if (idxNum == 3) {
        local_38 = (char *)0x0;
        pcVar6 = (char *)sqlite3ValueText(argv[1],'\x01');
        if (pcVar6 == (char *)0x0) {
          return 0;
        }
        iVar3 = sqlite3ValueBytes(argv[1],'\x01');
        iVar4 = sqlite3_initialize();
        if (iVar4 != 0) {
          cur[5].pVtab = (sqlite3_vtab *)0x0;
          return 7;
        }
        psVar5 = (sqlite3_vtab *)sqlite3Malloc((long)iVar3 + 1U);
        cur[5].pVtab = psVar5;
        if (psVar5 == (sqlite3_vtab *)0x0) {
          return 7;
        }
        memcpy(psVar5,pcVar6,(long)iVar3 + 1U);
        if ((*pcVar6 != '$') ||
           (psVar5 = (sqlite3_vtab *)
                     jsonLookupStep(pParse,0,(char *)((long)&(cur[5].pVtab)->pModule + 1),(int *)0x0
                                    ,&local_38), pcVar6 = local_38, local_38 != (char *)0x0)) {
          sqlite3_free(cur->pVtab->zErrMsg);
          pcVar6 = sqlite3_mprintf("JSON path error near \'%q\'",pcVar6);
          cur->pVtab->zErrMsg = pcVar6;
          jsonEachCursorReset((JsonEachCursor *)cur);
          if (cur->pVtab->zErrMsg == (char *)0x0) {
            return 7;
          }
          return 1;
        }
        if (psVar5 == (sqlite3_vtab *)0x0) {
          return 0;
        }
        psVar7 = cur[7].pVtab;
      }
      else {
        psVar5 = cur[7].pVtab;
        psVar7 = psVar5;
      }
      iVar3 = (int)((ulong)((long)psVar5 - (long)psVar7) >> 4);
      *(int *)&cur[2].pVtab = iVar3;
      *(int *)((long)&cur[1].pVtab + 4) = iVar3;
      bVar1 = *(byte *)&psVar5->pModule;
      *(byte *)&cur[3].pVtab = bVar1;
      if (bVar1 < 6) {
        *(int *)((long)&cur[2].pVtab + 4) = iVar3 + 1;
      }
      else {
        ((anon_union_8_5_9b08aacb_for_u *)&psVar5->nRef)->iAppend = 0;
        uVar2 = *(uint *)&cur[2].pVtab;
        *(u32 *)((long)&cur[2].pVtab + 4) = *(u32 *)((long)&psVar5->pModule + 4) + uVar2 + 1;
        if (*(char *)((long)&cur[3].pVtab + 1) != '\0') {
          *(undefined1 *)&cur[3].pVtab =
               *(undefined1 *)
                (&(cur[7].pVtab)->pModule +
                (ulong)*(uint *)((long)&(cur[9].pVtab)->pModule + (ulong)uVar2 * 4) * 2);
          if ((ulong)uVar2 == 0) {
            return 0;
          }
          if ((*(byte *)((long)&(cur[7].pVtab)->pModule + (ulong)(uVar2 - 1) * 0x10 + 1) & 0x40) !=
              0) {
            *(uint *)&cur[2].pVtab = uVar2 - 1;
            return 0;
          }
          return 0;
        }
        *(uint *)&cur[2].pVtab = uVar2 + 1;
      }
      return 0;
    }
    uVar2 = pParse->nNode;
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      psVar5 = (sqlite3_vtab *)sqlite3Malloc((ulong)uVar2 << 2);
      cur[9].pVtab = psVar5;
      if (psVar5 != (sqlite3_vtab *)0x0) {
        jsonParseFillInParentage(pParse,0,0);
        goto LAB_001a2fc8;
      }
    }
    else {
      cur[9].pVtab = (sqlite3_vtab *)0x0;
    }
    *(undefined1 *)&cur[10].pVtab = 1;
    iVar3 = 7;
  }
  else {
    iVar3 = 7;
    if (*(char *)&cur[10].pVtab == '\0') {
      sqlite3_free(cur->pVtab->zErrMsg);
      pcVar6 = sqlite3_mprintf("malformed JSON");
      cur->pVtab->zErrMsg = pcVar6;
      iVar3 = 1;
      if (pcVar6 == (char *)0x0) {
        iVar3 = 7;
      }
    }
  }
  jsonEachCursorReset((JsonEachCursor *)cur);
  return iVar3;
}

Assistant:

static int jsonEachFilter(
  sqlite3_vtab_cursor *cur,
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  const char *z;
  const char *zRoot = 0;
  sqlite3_int64 n;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(argc);
  jsonEachCursorReset(p);
  if( idxNum==0 ) return SQLITE_OK;
  z = (const char*)sqlite3_value_text(argv[0]);
  if( z==0 ) return SQLITE_OK;
  n = sqlite3_value_bytes(argv[0]);
  p->zJson = sqlite3_malloc64( n+1 );
  if( p->zJson==0 ) return SQLITE_NOMEM;
  memcpy(p->zJson, z, (size_t)n+1);
  if( jsonParse(&p->sParse, 0, p->zJson) ){
    int rc = SQLITE_NOMEM;
    if( p->sParse.oom==0 ){
      sqlite3_free(cur->pVtab->zErrMsg);
      cur->pVtab->zErrMsg = sqlite3_mprintf("malformed JSON");
      if( cur->pVtab->zErrMsg ) rc = SQLITE_ERROR;
    }
    jsonEachCursorReset(p);
    return rc;
  }else if( p->bRecursive && jsonParseFindParents(&p->sParse) ){
    jsonEachCursorReset(p);
    return SQLITE_NOMEM;
  }else{
    JsonNode *pNode = 0;
    if( idxNum==3 ){
      const char *zErr = 0;
      zRoot = (const char*)sqlite3_value_text(argv[1]);
      if( zRoot==0 ) return SQLITE_OK;
      n = sqlite3_value_bytes(argv[1]);
      p->zRoot = sqlite3_malloc64( n+1 );
      if( p->zRoot==0 ) return SQLITE_NOMEM;
      memcpy(p->zRoot, zRoot, (size_t)n+1);
      if( zRoot[0]!='$' ){
        zErr = zRoot;
      }else{
        pNode = jsonLookupStep(&p->sParse, 0, p->zRoot+1, 0, &zErr);
      }
      if( zErr ){
        sqlite3_free(cur->pVtab->zErrMsg);
        cur->pVtab->zErrMsg = jsonPathSyntaxError(zErr);
        jsonEachCursorReset(p);
        return cur->pVtab->zErrMsg ? SQLITE_ERROR : SQLITE_NOMEM;
      }else if( pNode==0 ){
        return SQLITE_OK;
      }
    }else{
      pNode = p->sParse.aNode;
    }
    p->iBegin = p->i = (int)(pNode - p->sParse.aNode);
    p->eType = pNode->eType;
    if( p->eType>=JSON_ARRAY ){
      assert( pNode->eU==0 );
      VVA( pNode->eU = 3 );
      pNode->u.iKey = 0;
      p->iEnd = p->i + pNode->n + 1;
      if( p->bRecursive ){
        p->eType = p->sParse.aNode[p->sParse.aUp[p->i]].eType;
        if( p->i>0 && (p->sParse.aNode[p->i-1].jnFlags & JNODE_LABEL)!=0 ){
          p->i--;
        }
      }else{
        p->i++;
      }
    }else{
      p->iEnd = p->i+1;
    }
  }
  return SQLITE_OK;
}